

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ConstantValue::convertToShortReal(ConstantValue *this)

{
  bool bVar1;
  ConstantValue *in_RDI;
  float v;
  double dVar2;
  ConstantValue *in_stack_ffffffffffffffb8;
  ConstantValue *this_00;
  shortreal_t sVar3;
  shortreal_t local_24;
  real_t in_stack_ffffffffffffffe0;
  shortreal_t local_14 [5];
  
  this_00 = in_RDI;
  bVar1 = isShortReal((ConstantValue *)0x66ba5a);
  if (bVar1) {
    ConstantValue(this_00,in_stack_ffffffffffffffb8);
  }
  else {
    bVar1 = isReal((ConstantValue *)0x66ba7e);
    if (bVar1) {
      real(in_stack_ffffffffffffffb8);
      sVar3.v = (float)((ulong)this_00 >> 0x20);
      dVar2 = real_t::operator_cast_to_double((real_t *)&stack0xffffffffffffffe0);
      shortreal_t::shortreal_t(local_14,(float)dVar2);
      ConstantValue(in_stack_ffffffffffffffb8,sVar3);
    }
    else {
      bVar1 = isInteger((ConstantValue *)0x66bac8);
      if (bVar1) {
        integer((ConstantValue *)0x66bad8);
        sVar3.v = (float)((ulong)this_00 >> 0x20);
        v = SVInt::toFloat((SVInt *)in_stack_ffffffffffffffe0.v);
        shortreal_t::shortreal_t(&local_24,v);
        ConstantValue(in_stack_ffffffffffffffb8,sVar3);
      }
      else {
        ConstantValue(this_00,in_stack_ffffffffffffffb8);
      }
    }
  }
  return in_RDI;
}

Assistant:

ConstantValue ConstantValue::convertToShortReal() const {
    if (isShortReal())
        return *this;

    if (isReal())
        return shortreal_t((float)real());

    if (isInteger())
        return shortreal_t(integer().toFloat());

    return nullptr;
}